

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

string * flatbuffers::anon_unknown_0::TypeToIntervalString<long>(void)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  string *in_RDI;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  NumToString<long>(&local_38,-0x8000000000000000);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x1550d9);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_48 = *plVar4;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar4;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar5;
    local_98 = (ulong *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  NumToString<long>(&local_78,0x7fffffffffffffff);
  uVar7 = 0xf;
  if (local_98 != &local_88) {
    uVar7 = local_88;
  }
  if (uVar7 < local_78._M_string_length + local_90) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar8 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_90 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_98);
      goto LAB_00125bc0;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
LAB_00125bc0:
  local_b8 = &local_a8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_a8 = *plVar2;
    uStack_a0 = puVar3[3];
  }
  else {
    local_a8 = *plVar2;
    local_b8 = (long *)*puVar3;
  }
  local_b0 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar6;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

static std::string TypeToIntervalString() {
  return "[" + NumToString((flatbuffers::numeric_limits<T>::lowest)()) + "; " +
         NumToString((flatbuffers::numeric_limits<T>::max)()) + "]";
}